

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase298::run(TestCase298 *this)

{
  Reader node;
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  Reader brand_02;
  bool bVar1;
  uint64_t uVar2;
  ArrayPtr<const_char> AVar3;
  Schema local_410;
  Reader local_408;
  Schema local_3d0;
  bool local_3c1;
  Schema SStack_3c0;
  bool _kj_shouldLog_5;
  Reader local_3b8;
  Schema local_388;
  Schema *local_380;
  undefined1 local_378 [8];
  DebugComparison<capnp::Schema_&,_capnp::Schema> _kjCondition_5;
  bool local_341;
  Schema SStack_340;
  bool _kj_shouldLog_4;
  Schema *local_338;
  undefined1 local_330 [8];
  DebugComparison<capnp::Schema_&,_capnp::Schema> _kjCondition_4;
  Reader local_300;
  ArrayPtr<const_char> local_2d0;
  Reader local_2c0;
  ArrayPtr<const_char> local_290;
  bool local_279;
  Schema SStack_278;
  bool _kj_shouldLog_3;
  Reader local_270;
  ArrayPtr<const_char> local_240;
  Reader local_230;
  ArrayPtr<const_char> local_200;
  ArrayPtr<const_char> local_1f0;
  undefined1 local_1e0 [8];
  DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> _kjCondition_3;
  bool _kj_shouldLog_2;
  Schema SStack_1a0;
  DebugExpression<bool> _kjCondition_2;
  Reader local_198;
  Schema local_160;
  Schema schema;
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  bool _kj_shouldLog;
  Reader local_138;
  undefined1 local_100 [16];
  DebugExpression<kj::Maybe<capnp::Schema>_> local_f0;
  undefined1 local_e0 [8];
  DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&> _kjCondition;
  SchemaLoader loader;
  Reader local_80;
  undefined1 local_50 [8];
  FakeLoaderCallback callback;
  TestCase298 *this_local;
  
  callback._56_8_ = this;
  loader.impl.value.ptr = (Impl *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  Schema::getProto(&local_80,(Schema *)&loader.impl.value.ptr);
  node._reader.capTable = local_80._reader.capTable;
  node._reader.segment = local_80._reader.segment;
  node._reader.data = local_80._reader.data;
  node._reader.pointers = local_80._reader.pointers;
  node._reader.dataSize = local_80._reader.dataSize;
  node._reader.pointerCount = local_80._reader.pointerCount;
  node._reader._38_2_ = local_80._reader._38_2_;
  node._reader.nestingLimit = local_80._reader.nestingLimit;
  node._reader._44_4_ = local_80._reader._44_4_;
  FakeLoaderCallback::FakeLoaderCallback((FakeLoaderCallback *)local_50,node);
  SchemaLoader::SchemaLoader((SchemaLoader *)&_kjCondition.result,(LazyLoadCallback *)local_50);
  local_138._reader.dataSize = 0;
  local_138._reader.pointerCount = 0;
  local_138._reader._38_2_ = 0;
  local_138._reader.nestingLimit = 0;
  local_138._reader._44_4_ = 0;
  local_138._reader.data = (void *)0x0;
  local_138._reader.pointers = (WirePointer *)0x0;
  local_138._reader.segment = (SegmentReader *)0x0;
  local_138._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_138);
  Schema::Schema((Schema *)&stack0xfffffffffffffeb0);
  brand._reader.capTable = local_138._reader.capTable;
  brand._reader.segment = local_138._reader.segment;
  brand._reader.data = local_138._reader.data;
  brand._reader.pointers = local_138._reader.pointers;
  brand._reader.dataSize = local_138._reader.dataSize;
  brand._reader.pointerCount = local_138._reader.pointerCount;
  brand._reader._38_2_ = local_138._reader._38_2_;
  brand._reader.nestingLimit = local_138._reader.nestingLimit;
  brand._reader._44_4_ = local_138._reader._44_4_;
  SchemaLoader::tryGet((SchemaLoader *)local_100,(uint64_t)&_kjCondition.result,brand,(Schema)0x4d2)
  ;
  kj::_::DebugExpressionStart::operator<<
            ((DebugExpressionStart *)&local_f0,(Maybe<capnp::Schema> *)&kj::_::MAGIC_ASSERT);
  kj::_::DebugExpression<kj::Maybe<capnp::Schema>>::operator==
            ((DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&> *)local_e0,
             (DebugExpression<kj::Maybe<capnp::Schema>> *)&local_f0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<capnp::Schema>_>::~DebugExpression(&local_f0);
  kj::Maybe<capnp::Schema>::~Maybe((Maybe<capnp::Schema> *)local_100);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
  if (!bVar1) {
    schema.raw._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)schema.raw._7_1_ != false) {
      kj::_::Debug::
      log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<capnp::Schema>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x12e,ERROR,
                 "\"failed: expected \" \"loader.tryGet(1234) == kj::none\", _kjCondition",
                 (char (*) [49])"failed: expected loader.tryGet(1234) == kj::none",
                 (DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&> *)local_e0);
      schema.raw._7_1_ = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::Schema>,_const_kj::None_&> *)local_e0);
  bVar1 = FakeLoaderCallback::isLoaded((FakeLoaderCallback *)local_50);
  schema.raw._5_1_ = ~bVar1 & 1;
  schema.raw._6_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&schema.raw + 5));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&schema.raw + 6));
  if (!bVar1) {
    schema.raw._4_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)schema.raw._4_1_ != false) {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x130,ERROR,"\"failed: expected \" \"!(callback.isLoaded())\", _kjCondition",
                 (char (*) [40])"failed: expected !(callback.isLoaded())",
                 (DebugExpression<bool> *)((long)&schema.raw + 6));
      schema.raw._4_1_ = false;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  local_198._reader.dataSize = 0;
  local_198._reader.pointerCount = 0;
  local_198._reader._38_2_ = 0;
  local_198._reader.nestingLimit = 0;
  local_198._reader._44_4_ = 0;
  local_198._reader.data = (void *)0x0;
  local_198._reader.pointers = (WirePointer *)0x0;
  local_198._reader.segment = (SegmentReader *)0x0;
  local_198._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_198);
  Schema::Schema(&stack0xfffffffffffffe60);
  brand_00._reader.capTable = local_198._reader.capTable;
  brand_00._reader.segment = local_198._reader.segment;
  brand_00._reader.data = local_198._reader.data;
  brand_00._reader.pointers = local_198._reader.pointers;
  brand_00._reader.dataSize = local_198._reader.dataSize;
  brand_00._reader.pointerCount = local_198._reader.pointerCount;
  brand_00._reader._38_2_ = local_198._reader._38_2_;
  brand_00._reader.nestingLimit = local_198._reader.nestingLimit;
  brand_00._reader._44_4_ = local_198._reader._44_4_;
  local_160 = SchemaLoader::get((SchemaLoader *)&_kjCondition.result,uVar2,brand_00,SStack_1a0);
  _kjCondition_3._54_1_ = FakeLoaderCallback::isLoaded((FakeLoaderCallback *)local_50);
  _kjCondition_3._55_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_3.field_0x36);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_3.field_0x37);
  if (!bVar1) {
    _kjCondition_3._53_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._53_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x132,ERROR,"\"failed: expected \" \"callback.isLoaded()\", _kjCondition",
                 (char (*) [37])"failed: expected callback.isLoaded()",
                 (DebugExpression<bool> *)&_kjCondition_3.field_0x37);
      _kjCondition_3._53_1_ = 0;
    }
  }
  Schema::getProto(&local_230,&local_160);
  local_200 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_230);
  local_1f0 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_200);
  SStack_278.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  Schema::getProto(&local_270,&stack0xfffffffffffffd88);
  local_240 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_270);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)local_1e0,
             (DebugExpression<capnp::Text::Reader> *)&local_1f0,(Reader *)&local_240);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e0);
  if (!bVar1) {
    local_279 = kj::_::Debug::shouldLog(ERROR);
    while (local_279 != false) {
      Schema::getProto(&local_2c0,&local_160);
      AVar3 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_2c0);
      local_290 = AVar3;
      _kjCondition_4._32_8_ = Schema::from<capnproto_test::capnp::test::TestAllTypes>();
      Schema::getProto(&local_300,(Schema *)&_kjCondition_4.result);
      AVar3 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_300);
      local_2d0 = AVar3;
      kj::_::Debug::
      log<char_const(&)[116],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x135,ERROR,
                 "\"failed: expected \" \"(schema.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())\", _kjCondition, schema.getProto().getDisplayName(), Schema::from<TestAllTypes>().getProto().getDisplayName()"
                 ,(char (*) [116])
                  "failed: expected (schema.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())"
                 ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)local_1e0,
                 (Reader *)&local_290,(Reader *)&local_2d0);
      local_279 = false;
    }
  }
  local_338 = (Schema *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_160);
  uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  SStack_340 = Schema::getDependency(&local_160,uVar2);
  kj::_::DebugExpression<capnp::Schema&>::operator==
            ((DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_330,
             (DebugExpression<capnp::Schema&> *)&local_338,&stack0xfffffffffffffcc0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
  if (!bVar1) {
    local_341 = kj::_::Debug::shouldLog(ERROR);
    while (local_341 != false) {
      uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                        ();
      _kjCondition_5._32_8_ = Schema::getDependency(&local_160,uVar2);
      kj::_::Debug::
      log<char_const(&)[76],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x137,ERROR,
                 "\"failed: expected \" \"(schema) == (schema.getDependency(typeId<TestAllTypes>()))\", _kjCondition, schema, schema.getDependency(typeId<TestAllTypes>())"
                 ,(char (*) [76])
                  "failed: expected (schema) == (schema.getDependency(typeId<TestAllTypes>()))",
                 (DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_330,&local_160,
                 (Schema *)&_kjCondition_5.result);
      local_341 = false;
    }
  }
  local_380 = (Schema *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_160);
  uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                    ();
  local_3b8._reader.dataSize = 0;
  local_3b8._reader.pointerCount = 0;
  local_3b8._reader._38_2_ = 0;
  local_3b8._reader.nestingLimit = 0;
  local_3b8._reader._44_4_ = 0;
  local_3b8._reader.data = (void *)0x0;
  local_3b8._reader.pointers = (WirePointer *)0x0;
  local_3b8._reader.segment = (SegmentReader *)0x0;
  local_3b8._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_3b8);
  Schema::Schema(&stack0xfffffffffffffc40);
  brand_01._reader.capTable = local_3b8._reader.capTable;
  brand_01._reader.segment = local_3b8._reader.segment;
  brand_01._reader.data = local_3b8._reader.data;
  brand_01._reader.pointers = local_3b8._reader.pointers;
  brand_01._reader.dataSize = local_3b8._reader.dataSize;
  brand_01._reader.pointerCount = local_3b8._reader.pointerCount;
  brand_01._reader._38_2_ = local_3b8._reader._38_2_;
  brand_01._reader.nestingLimit = local_3b8._reader.nestingLimit;
  brand_01._reader._44_4_ = local_3b8._reader._44_4_;
  local_388 = SchemaLoader::get((SchemaLoader *)&_kjCondition.result,uVar2,brand_01,SStack_3c0);
  kj::_::DebugExpression<capnp::Schema&>::operator==
            ((DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_378,
             (DebugExpression<capnp::Schema&> *)&local_380,&local_388);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_378);
  if (!bVar1) {
    local_3c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c1 != false) {
      uVar2 = typeId<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
                        ();
      local_408._reader.dataSize = 0;
      local_408._reader.pointerCount = 0;
      local_408._reader._38_2_ = 0;
      local_408._reader.nestingLimit = 0;
      local_408._reader._44_4_ = 0;
      local_408._reader.data = (void *)0x0;
      local_408._reader.pointers = (WirePointer *)0x0;
      local_408._reader.segment = (SegmentReader *)0x0;
      local_408._reader.capTable = (CapTableReader *)0x0;
      capnp::schema::Brand::Reader::Reader(&local_408);
      Schema::Schema(&local_410);
      brand_02._reader.capTable = local_408._reader.capTable;
      brand_02._reader.segment = local_408._reader.segment;
      brand_02._reader.data = local_408._reader.data;
      brand_02._reader.pointers = local_408._reader.pointers;
      brand_02._reader.dataSize = local_408._reader.dataSize;
      brand_02._reader.pointerCount = local_408._reader.pointerCount;
      brand_02._reader._38_2_ = local_408._reader._38_2_;
      brand_02._reader.nestingLimit = local_408._reader.nestingLimit;
      brand_02._reader._44_4_ = local_408._reader._44_4_;
      local_3d0 = SchemaLoader::get((SchemaLoader *)&_kjCondition.result,uVar2,brand_02,local_410);
      kj::_::Debug::
      log<char_const(&)[66],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x138,ERROR,
                 "\"failed: expected \" \"(schema) == (loader.get(typeId<TestAllTypes>()))\", _kjCondition, schema, loader.get(typeId<TestAllTypes>())"
                 ,(char (*) [66])"failed: expected (schema) == (loader.get(typeId<TestAllTypes>()))"
                 ,(DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_378,&local_160,&local_3d0
                );
      local_3c1 = false;
    }
  }
  SchemaLoader::~SchemaLoader((SchemaLoader *)&_kjCondition.result);
  return;
}

Assistant:

TEST(SchemaLoader, LazyLoad) {
  FakeLoaderCallback callback(Schema::from<TestAllTypes>().getProto());
  SchemaLoader loader(callback);

  EXPECT_TRUE(loader.tryGet(1234) == kj::none);

  EXPECT_FALSE(callback.isLoaded());
  Schema schema = loader.get(typeId<TestAllTypes>());
  EXPECT_TRUE(callback.isLoaded());

  EXPECT_EQ(schema.getProto().getDisplayName(),
            Schema::from<TestAllTypes>().getProto().getDisplayName());

  EXPECT_EQ(schema, schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_EQ(schema, loader.get(typeId<TestAllTypes>()));
}